

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O2

Char * __thiscall Diligent::StringPool::Allocate(StringPool *this,size_t Length)

{
  Char *pCVar1;
  string msg;
  
  pCVar1 = this->m_pCurrPtr;
  if (this->m_pBuffer + this->m_ReservedSize < pCVar1 + Length) {
    FormatString<char[31]>(&msg,(char (*) [31])"Not enough space in the buffer");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
               ,0x76);
    std::__cxx11::string::~string((string *)&msg);
    pCVar1 = this->m_pCurrPtr;
  }
  this->m_pCurrPtr = pCVar1 + Length;
  return pCVar1;
}

Assistant:

Char* Allocate(size_t Length)
    {
        VERIFY(m_pCurrPtr + Length <= m_pBuffer + m_ReservedSize, "Not enough space in the buffer");
        auto* Ptr = m_pCurrPtr;
        m_pCurrPtr += Length;
        return Ptr;
    }